

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::tracker_scrape_response
          (torrent *this,tracker_request *req,int complete,int incomplete,int downloaded,int param_5
          )

{
  bool bVar1;
  int iVar2;
  value_type *pvVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_70 [24];
  announce_endpoint *aep;
  endpoint local_endpoint;
  announce_entry *ae;
  int local_28;
  int iStack_24;
  protocol_version hash_version;
  int param_5_local;
  int downloaded_local;
  int incomplete_local;
  int complete_local;
  tracker_request *req_local;
  torrent *this_local;
  
  local_28 = param_5;
  iStack_24 = downloaded;
  param_5_local = incomplete;
  downloaded_local = complete;
  _incomplete_local = (peer_list *)req;
  req_local = (tracker_request *)this;
  bVar1 = digest32<160L>::operator==(&req->info_hash,&(this->m_info_hash).v1);
  ae._7_1_ = !bVar1;
  local_endpoint.impl_.data_._20_8_ =
       tracker_list::find_tracker(&this->m_trackers,(string *)_incomplete_local);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<boost::asio::ip::tcp> *)((long)&aep + 4));
  if ((local_endpoint.impl_.data_._20_8_ != 0) &&
     (local_70._16_8_ =
           announce_entry::find_endpoint
                     ((announce_entry *)local_endpoint.impl_.data_._20_8_,
                      (listen_socket_handle *)((long)_incomplete_local + 0xe0)),
     (announce_endpoint *)local_70._16_8_ != (announce_endpoint *)0x0)) {
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
              ((basic_endpoint<boost::asio::ip::tcp> *)((long)&aep + 4),
               (basic_endpoint<boost::asio::ip::tcp> *)local_70._16_8_);
    iVar2 = param_5_local;
    if (-1 < param_5_local) {
      pvVar3 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
               ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                             *)&(((vector<aux::vector<piece_hash_request>,_file_index_t> *)
                                 (local_70._16_8_ + 0x10))->
                                super_vector<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
                                ).
                                super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,ae._7_1_);
      pvVar3->scrape_incomplete = iVar2;
    }
    iVar2 = downloaded_local;
    if (-1 < downloaded_local) {
      pvVar3 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
               ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                             *)((undefined1 *)(local_70._16_8_ + 0x10) + 0x10),ae._7_1_);
      pvVar3->scrape_complete = iVar2;
    }
    iVar2 = iStack_24;
    if (-1 < iStack_24) {
      pvVar3 = container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
               ::operator[]((container_wrapper<libtorrent::aux::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::aux::announce_infohash,_2UL>_>
                             *)&(((vector<aux::vector<piece_hash_request>,_file_index_t> *)
                                 (local_70._16_8_ + 0x10))->
                                super_vector<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
                                ).
                                super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,ae._7_1_);
      pvVar3->scrape_downloaded = iVar2;
    }
    update_scrape_state(this);
  }
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  bVar1 = alert_manager::should_post<libtorrent::scrape_reply_alert>
                    ((alert_manager *)CONCAT44(extraout_var,iVar2));
  if ((bVar1) ||
     (((ulong)_incomplete_local[1].m_candidate_cache.
              super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x100) != 0)) {
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_70);
    alert_manager::
    emplace_alert<libtorrent::scrape_reply_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int_const&,int_const&,std::__cxx11::string_const&,libtorrent::protocol_version_const&>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar2),(torrent_handle *)local_70,
               (basic_endpoint<boost::asio::ip::tcp> *)((long)&aep + 4),&param_5_local,
               &downloaded_local,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               _incomplete_local,(protocol_version *)((long)&ae + 7));
    torrent_handle::~torrent_handle((torrent_handle *)local_70);
  }
  return;
}

Assistant:

void torrent::tracker_scrape_response(tracker_request const& req
		, int const complete, int const incomplete, int const downloaded, int /* downloaders */)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;
		TORRENT_ASSERT(req.kind & tracker_request::scrape_request);

		protocol_version const hash_version = req.info_hash == m_info_hash.v1
			? protocol_version::V1 : protocol_version::V2;

		aux::announce_entry* ae = m_trackers.find_tracker(req.url);
		tcp::endpoint local_endpoint;
		if (ae)
		{
			auto* aep = ae->find_endpoint(req.outgoing_socket);
			if (aep)
			{
				local_endpoint = aep->local_endpoint;
				if (incomplete >= 0) aep->info_hashes[hash_version].scrape_incomplete = incomplete;
				if (complete >= 0) aep->info_hashes[hash_version].scrape_complete = complete;
				if (downloaded >= 0) aep->info_hashes[hash_version].scrape_downloaded = downloaded;

				update_scrape_state();
			}
		}

		// if this was triggered manually we need to post this unconditionally,
		// since the client expects a response from its action, regardless of
		// whether all tracker events have been enabled by the alert mask
		if (m_ses.alerts().should_post<scrape_reply_alert>()
			|| req.triggered_manually)
		{
			m_ses.alerts().emplace_alert<scrape_reply_alert>(
				get_handle(), local_endpoint, incomplete, complete, req.url, hash_version);
		}
	}